

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O2

void Aig_ManJustExperiment(Aig_Man_t *pAig)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *p;
  int *piVar3;
  Aig_ManPack_t *p_00;
  Vec_Int_t *p_01;
  Aig_Obj_t *pNode;
  abctime aVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  uint local_50;
  uint local_4c;
  ulong local_48;
  
  aVar2 = Abc_Clock();
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  p_00 = Aig_ManPackStart(pAig);
  p_01 = Aig_ManPackConstNodes(p_00);
  iVar7 = 0;
  local_48 = 0;
  local_4c = 0;
  uVar6 = 0;
  local_50 = 0;
  iVar5 = 0;
  do {
    if (p_01->nSize <= iVar7) {
      Vec_IntFree(p);
      dVar8 = (double)(int)(uVar6 + (int)local_48);
      iVar7 = 0x7e4257;
      printf("PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ",
             (dVar8 * 100.0) / (double)pAig->nObjs[3],(double)iVar5 / dVar8,
             (ulong)(uint)pAig->nObjs[3],local_48,(ulong)local_4c,(ulong)uVar6,(ulong)local_50);
      aVar4 = Abc_Clock();
      Abc_Print(iVar7,"%s =","T");
      Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
      Aig_ManCleanMarkAB(pAig);
      Aig_ManPackStop(p_00);
      Vec_IntFree(p_01);
      return;
    }
    iVar1 = Vec_IntEntry(p_01,iVar7);
    if (pAig->vObjs == (Vec_Ptr_t *)0x0) {
      pNode = (Aig_Obj_t *)0x0;
    }
    else {
      pNode = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar1);
    }
    if ((pNode->field_0x18 & 8) == 0) {
      iVar1 = Aig_ObjFindSatAssign(pAig,pNode,1,p);
      if (iVar1 == 0) {
        local_50 = local_50 + 1;
      }
      else {
        uVar6 = uVar6 + 1;
LAB_0052109d:
        iVar5 = iVar5 + p->nSize;
        Aig_ManPackAddPattern(p_00,p);
      }
    }
    else {
      iVar1 = Aig_ObjFindSatAssign(pAig,pNode,0,p);
      if (iVar1 != 0) {
        local_48 = (ulong)((int)local_48 + 1);
        goto LAB_0052109d;
      }
      local_4c = local_4c + 1;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Aig_ManJustExperiment( Aig_Man_t * pAig )
{
    Aig_ManPack_t * pPack;
    Vec_Int_t * vSuppLits, * vNodes;
    Aig_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    int Count0 = 0, Count0f = 0, Count1 = 0, Count1f = 0;
    int nTotalLits = 0;
    vSuppLits = Vec_IntAlloc( 100 );
    pPack = Aig_ManPackStart( pAig );
    vNodes = Aig_ManPackConstNodes( pPack );
//    Aig_ManForEachCo( pAig, pObj, i )
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
    {
        if ( pObj->fPhase ) // const 1
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 0, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL0 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL0 )
//                    printf( "Justification error!\n" );
                Count0++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count0f++;
        }
        else
        {
            if ( Aig_ObjFindSatAssign(pAig, pObj, 1, vSuppLits) )
            {
//                assert( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) == AIG_VAL1 );
//                if ( Aig_ObjTerSimulate(pAig, pObj, vSuppLits) != AIG_VAL1 )
//                    printf( "Justification error!\n" );
                Count1++;
                nTotalLits += Vec_IntSize(vSuppLits);
                Aig_ManPackAddPattern( pPack, vSuppLits );
            }
            else
                Count1f++;
        }
    }
    Vec_IntFree( vSuppLits );
    printf( "PO =%6d. C0 =%6d. C0f =%6d. C1 =%6d. C1f =%6d. (%6.2f %%) Ave =%4.1f ", 
        Aig_ManCoNum(pAig), Count0, Count0f, Count1, Count1f, 100.0*(Count0+Count1)/Aig_ManCoNum(pAig), 1.0*nTotalLits/(Count0+Count1) );
    Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    Aig_ManCleanMarkAB( pAig );
    Aig_ManPackStop( pPack );
    Vec_IntFree( vNodes );
}